

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unixOpen(unqlite_vfs *pVfs,char *zPath,unqlite_file *pFile,uint flags)

{
  int iVar1;
  unixInodeInfo *puVar2;
  UnixUnusedFd **ppUVar3;
  unqlite_io_methods *puVar4;
  int iVar5;
  uint uVar6;
  sxi32 sVar7;
  unqlite_io_methods *puVar8;
  int *piVar9;
  UnixUnusedFd **ppUVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  unixInodeInfo **ppuVar14;
  int dirfd;
  unqlite_file *local_e8;
  int local_dc;
  dev_t local_d8;
  ino_t iStack_d0;
  stat local_c8;
  
  dirfd = -1;
  SyZero(pFile,0x48);
  iVar5 = stat(zPath,&local_c8);
  if (iVar5 == 0) {
    ppuVar14 = &inodeList;
    while (puVar2 = *ppuVar14, puVar2 != (unixInodeInfo *)0x0) {
      if (((puVar2->fileId).dev == local_c8.st_dev) && ((puVar2->fileId).ino == local_c8.st_ino)) {
        ppUVar3 = &puVar2->pUnused;
        goto LAB_0010ecf1;
      }
      ppuVar14 = &puVar2->pNext;
    }
  }
LAB_0010eb69:
  puVar8 = (unqlite_io_methods *)unqlite_malloc(0x10);
  if (puVar8 == (unqlite_io_methods *)0x0) {
    return -1;
  }
  pFile[5].pMethods = puVar8;
LAB_0010eb8e:
  local_e8 = pFile + 5;
  iVar13 = (flags & 4) * 0x10;
  iVar5 = iVar13 + 0x20080;
  if ((flags & 8) == 0) {
    iVar5 = iVar13;
  }
  uVar11 = 0x180;
  if ((flags & 0x10) == 0) {
    uVar11 = 0x1a4;
  }
  iVar5 = open(zPath,iVar5 + (flags & 2),uVar11);
  if (iVar5 < 0) {
    iVar13 = -2;
    goto LAB_0010eccc;
  }
  puVar8 = local_e8->pMethods;
  if (puVar8 != (unqlite_io_methods *)0x0) goto LAB_0010ebde;
  goto LAB_0010ebe5;
  while (ppUVar3 = (UnixUnusedFd **)&puVar8->xClose, *(uint *)&puVar8->field_0x4 != flags) {
LAB_0010ecf1:
    ppUVar10 = ppUVar3;
    puVar8 = (unqlite_io_methods *)*ppUVar10;
    if (puVar8 == (unqlite_io_methods *)0x0) goto LAB_0010eb69;
  }
  *ppUVar10 = (UnixUnusedFd *)puVar8->xClose;
  iVar5 = puVar8->iVersion;
  local_e8 = pFile + 5;
  pFile[5].pMethods = puVar8;
  if (iVar5 < 0) goto LAB_0010eb8e;
LAB_0010ebde:
  puVar8->iVersion = iVar5;
  *(uint *)&puVar8->field_0x4 = flags;
LAB_0010ebe5:
  if ((flags & 0x10) != 0) {
    unlink(zPath);
  }
  if (((flags & 4) == 0) || (iVar13 = openDirectory(zPath,&dirfd), iVar13 == 0)) {
    uVar6 = fcntl(iVar5,1,0);
    fcntl(iVar5,2,(ulong)(uVar6 | 1));
    iVar12 = dirfd;
    *(int *)&pFile[2].pMethods = iVar5;
    *(int *)((long)&pFile[2].pMethods + 4) = dirfd;
    *(undefined4 *)&pFile[6].pMethods = 0;
    pFile[7].pMethods = (unqlite_io_methods *)zPath;
    iVar13 = fstat(iVar5,&local_c8);
    if (iVar13 == 0) {
      local_dc = iVar12;
      iVar13 = -1;
      SyZero(&local_d8,0x10);
      local_d8 = local_c8.st_dev;
      iStack_d0 = local_c8.st_ino;
      ppuVar14 = &inodeList;
      while (puVar8 = (unqlite_io_methods *)*ppuVar14, puVar8 != (unqlite_io_methods *)0x0) {
        sVar7 = SyMemcmp(&local_d8,puVar8,0x10);
        if (sVar7 == 0) {
          *(int *)&puVar8->xWrite = *(int *)&puVar8->xWrite + 1;
          puVar4 = (unqlite_io_methods *)inodeList;
          goto LAB_0010ede5;
        }
        ppuVar14 = (unixInodeInfo **)&puVar8->xSync;
      }
      puVar8 = (unqlite_io_methods *)unqlite_malloc(0x38);
      iVar12 = local_dc;
      if (puVar8 != (unqlite_io_methods *)0x0) {
        SyZero(puVar8,0x38);
        SyMemcpy(&local_d8,puVar8,0x10);
        *(int *)&puVar8->xWrite = 1;
        puVar8->xSync = (_func_int_unqlite_file_ptr_int *)inodeList;
        puVar8->xFileSize = (_func_int_unqlite_file_ptr_unqlite_int64_ptr *)0x0;
        puVar4 = puVar8;
        if (inodeList != (unixInodeInfo *)0x0) {
          inodeList->pPrev = (unixInodeInfo *)puVar8;
        }
LAB_0010ede5:
        inodeList = (unixInodeInfo *)puVar4;
        pFile[1].pMethods = puVar8;
        *(undefined4 *)((long)&pFile[3].pMethods + 4) = 0;
        pFile->pMethods = &unixIoMethod;
        return 0;
      }
    }
    else {
      piVar9 = __errno_location();
      iVar1 = *piVar9;
      *(int *)((long)&pFile[3].pMethods + 4) = iVar1;
      iVar13 = -2;
      if (iVar1 == 0x4b) {
        iVar13 = -0x11;
      }
    }
    close(iVar5);
    *(undefined4 *)((long)&pFile[3].pMethods + 4) = 0;
    iVar5 = iVar12;
    if (iVar12 < 0) goto LAB_0010eccc;
  }
  close(iVar5);
LAB_0010eccc:
  unqlite_free(local_e8->pMethods);
  return iVar13;
}

Assistant:

static int unixOpen(
  unqlite_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  unqlite_file *pFile,         /* The file descriptor to be filled in */
  unsigned int flags           /* Input flags to control the opening */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int dirfd = -1;                /* Directory file descriptor */
  int openFlags = 0;             /* Flags to pass to open() */
  int noLock;                    /* True to omit locking primitives */
  int rc = UNQLITE_OK;            /* Function Return Code */
  UnixUnusedFd *pUnused;
  int isExclusive  = (flags & UNQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & UNQLITE_OPEN_TEMP_DB);
  int isCreate     = (flags & UNQLITE_OPEN_CREATE);
  int isReadonly   = (flags & UNQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & UNQLITE_OPEN_READWRITE);
  /* If creating a master or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
#ifndef UNQLITE_DISABLE_DIRSYNC
  int isOpenDirectory = isCreate;
#endif
  const char *zName = zPath;

  SyZero(p,sizeof(unixFile));
  
  pUnused = findReusableFd(zName, flags);
  if( pUnused ){
	  fd = pUnused->fd;
  }else{
	  pUnused = unqlite_malloc(sizeof(*pUnused));
      if( !pUnused ){
        return UNQLITE_NOMEM;
      }
  }
  p->pUnused = pUnused;
  
  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the 
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    rc = findCreateFileMode(zName, flags, &openMode);
    if( rc!=UNQLITE_OK ){
      return rc;
    }
    fd = open(zName, openFlags, openMode);
    if( fd<0 ){
	  rc = UNQLITE_IOERR;
      goto open_finished;
    }
  }
  
  if( p->pUnused ){
    p->pUnused->fd = fd;
    p->pUnused->flags = flags;
  }

  if( isDelete ){
    unlink(zName);
  }

#ifndef UNQLITE_DISABLE_DIRSYNC
  if( isOpenDirectory ){
    rc = openDirectory(zPath, &dirfd);
    if( rc!=UNQLITE_OK ){
      /* It is safe to close fd at this point, because it is guaranteed not
      ** to be open on a database file. If it were open on a database file,
      ** it would not be safe to close as this would release any locks held
      ** on the file by this process.  */
      close(fd);             /* silently leak if fail, already in error */
      goto open_finished;
    }
  }
#endif

#ifdef FD_CLOEXEC
  fcntl(fd, F_SETFD, fcntl(fd, F_GETFD, 0) | FD_CLOEXEC);
#endif

  noLock = 0;

#if defined(__APPLE__) 
  struct statfs fsInfo;
  if( fstatfs(fd, &fsInfo) == -1 ){
    ((unixFile*)pFile)->lastErrno = errno;
    if( dirfd>=0 ) close(dirfd); /* silently leak if fail, in error */
    close(fd); /* silently leak if fail, in error */
    return UNQLITE_IOERR;
  }
  if (0 == SyStrncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= UNQLITE_FSFLAGS_IS_MSDOS;
  }
#endif
  
  rc = fillInUnixFile(pVfs, fd, dirfd, pFile, zPath, noLock, isDelete);
open_finished:
  if( rc!=UNQLITE_OK ){
    unqlite_free(p->pUnused);
  }
  return rc;
}